

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O3

void display_options_item
               (menu_conflict *menu,wchar_t oid,_Bool cursor,wchar_t row,wchar_t col,wchar_t width)

{
  anon_struct_24_3_d8ca22ae *paVar1;
  object_kind *poVar2;
  ulong uVar3;
  ulong uVar4;
  uint8_t *puVar5;
  long lVar6;
  bool bVar7;
  bool bVar8;
  
  lVar6 = (long)oid;
  if ((uint)oid < 0xf) {
    paVar1 = (anon_struct_24_3_d8ca22ae *)(sval_dependent + lVar6);
    uVar4 = (ulong)z_info->k_max;
    if (uVar4 < 2) {
      uVar4 = 0;
    }
    else {
      bVar7 = true;
      uVar3 = 2;
      poVar2 = k_info;
      do {
        if (((poVar2[1].name != (char *)0x0) && (poVar2[1].everseen == true)) &&
           (poVar2[1].tval == sval_dependent[lVar6].tval)) break;
        bVar7 = uVar3 < uVar4;
        bVar8 = uVar3 != uVar4;
        uVar3 = uVar3 + 1;
        poVar2 = poVar2 + 1;
      } while (bVar8);
      uVar4 = (ulong)bVar7;
    }
    puVar5 = curs_attrs[uVar4] + cursor;
  }
  else {
    if (2 < lVar6 - 0x10U) {
      return;
    }
    puVar5 = curs_attrs[1] + cursor;
    paVar1 = extra_item_options + (lVar6 - 0x10U);
  }
  c_prt(*puVar5,paVar1->name,row,col);
  return;
}

Assistant:

static void display_options_item(struct menu *menu, int oid, bool cursor,
								 int row, int col, int width)
{
	size_t line = (size_t) oid;

	/* Most of the menu is svals, with a small "extra options" section below */
	if (line < N_ELEMENTS(sval_dependent)) {
		bool known = seen_tval(sval_dependent[line].tval);
		uint8_t attr = curs_attrs[known ? CURS_KNOWN: CURS_UNKNOWN][(int)cursor];

		c_prt(attr, sval_dependent[line].desc, row, col);
	} else {
		uint8_t attr = curs_attrs[CURS_KNOWN][(int)cursor];

		line = line - N_ELEMENTS(sval_dependent) - 1;

		if (line < N_ELEMENTS(extra_item_options))
			c_prt(attr, extra_item_options[line].name, row, col);
	}
}